

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O2

bool cmsys::SystemTools::Split
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *lines)

{
  size_type sVar1;
  ulong uVar2;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string data;
  
  std::__cxx11::string::string((string *)&data,(string *)str);
  uVar3 = 0;
  do {
    sVar1 = data._M_string_length;
    if (data._M_string_length <= uVar3) {
LAB_0011087e:
      std::__cxx11::string::~string((string *)&data);
      return sVar1 <= uVar3;
    }
    uVar2 = std::__cxx11::string::find_first_of((char *)&data,0x114115);
    if (uVar2 == 0xffffffffffffffff) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&data);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines,
                 &local_70);
      std::__cxx11::string::~string((string *)&local_70);
      goto LAB_0011087e;
    }
    if ((uVar3 < uVar2) && (data._M_dataplus._M_p[uVar2 - 1] == '\r')) {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&data);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines,
                 &local_70);
    }
    else {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)&data);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)lines,
                 &local_70);
    }
    std::__cxx11::string::~string((string *)&local_70);
    uVar3 = uVar2 + 1;
  } while( true );
}

Assistant:

bool SystemTools::Split(const kwsys_stl::string& str, kwsys_stl::vector<kwsys_stl::string>& lines)
{
  kwsys_stl::string data(str);
  kwsys_stl::string::size_type lpos = 0;
  while(lpos < data.length())
    {
    kwsys_stl::string::size_type rpos = data.find_first_of("\n", lpos);
    if(rpos == kwsys_stl::string::npos)
      {
      // Line ends at end of string without a newline.
      lines.push_back(data.substr(lpos));
      return false;
      }
    if((rpos > lpos) && (data[rpos-1] == '\r'))
      {
      // Line ends in a "\r\n" pair, remove both characters.
      lines.push_back(data.substr(lpos, (rpos-1)-lpos));
      }
    else
      {
      // Line ends in a "\n", remove the character.
      lines.push_back(data.substr(lpos, rpos-lpos));
      }
    lpos = rpos+1;
    }
  return true;
}